

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  HuffmanCode *pHVar4;
  ulong uVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  uint32_t uVar11;
  HuffmanCode *pHVar12;
  uint32_t uVar13;
  size_t sVar14;
  uint uVar15;
  BrotliBitReader *br;
  uint local_44;
  BrotliBitReader *local_40;
  uint local_34;
  
  uVar2 = s->num_block_types[1];
  if (uVar2 < 2) {
LAB_00105960:
    iVar9 = 0;
  }
  else {
    pHVar12 = s->block_type_trees;
    pHVar4 = s->block_len_trees;
    local_40 = &s->br;
    uVar5 = (s->br).val_;
    uVar3 = (s->br).bit_pos_;
    pbVar6 = (s->br).next_in;
    sVar7 = (s->br).avail_in;
    uVar15 = uVar3 - 0x32;
    uVar10 = uVar5;
    uVar11 = uVar3;
    pbVar8 = pbVar6;
    sVar14 = sVar7;
    while (uVar15 < 0xf) {
      sVar14 = sVar14 - 1;
      if (sVar14 == 0xffffffffffffffff) {
        iVar9 = SafeDecodeSymbol(pHVar12 + 0x278,local_40,&local_44);
        br = local_40;
        if (iVar9 != 0) goto LAB_00105773;
        goto LAB_00105960;
      }
      (s->br).val_ = uVar10 >> 8;
      uVar10 = uVar10 >> 8 | (ulong)*pbVar8 << 0x38;
      (s->br).val_ = uVar10;
      (s->br).bit_pos_ = uVar11 - 8;
      (s->br).avail_in = sVar14;
      (s->br).next_in = pbVar8 + 1;
      uVar15 = uVar11 - 0x3a;
      uVar11 = uVar11 - 8;
      pbVar8 = pbVar8 + 1;
    }
    uVar10 = uVar10 >> ((byte)uVar11 & 0x3f);
    pHVar12 = pHVar12 + 0x278 + (uVar10 & 0xff);
    uVar15 = (uint)pHVar12->bits;
    if (8 < uVar15) {
      uVar11 = uVar11 + 8;
      pHVar12 = pHVar12 + (ulong)pHVar12->value +
                          (ulong)((uint)(uVar10 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] &
                                 0x7f);
      uVar15 = (uint)pHVar12->bits;
    }
    (s->br).bit_pos_ = uVar15 + uVar11;
    local_44 = (uint)pHVar12->value;
    br = local_40;
LAB_00105773:
    local_40 = (BrotliBitReader *)pbVar6;
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar11 = (s->br).bit_pos_;
      if (uVar11 - 0x32 < 0xf) {
        sVar14 = (s->br).avail_in;
        uVar13 = uVar11;
        do {
          sVar14 = sVar14 - 1;
          if (sVar14 == 0xffffffffffffffff) {
            iVar9 = SafeDecodeSymbol(pHVar4 + 0x18c,br,&local_34);
            if (iVar9 != 0) goto LAB_0010587b;
            goto LAB_00105941;
          }
          uVar10 = (s->br).val_;
          pbVar6 = (s->br).next_in;
          (s->br).val_ = uVar10 >> 8;
          uVar10 = (ulong)*pbVar6 << 0x38 | uVar10 >> 8;
          (s->br).val_ = uVar10;
          uVar11 = uVar13 - 8;
          (s->br).bit_pos_ = uVar11;
          (s->br).avail_in = sVar14;
          (s->br).next_in = pbVar6 + 1;
          uVar15 = uVar13 - 0x3a;
          uVar13 = uVar11;
        } while (uVar15 < 0xf);
      }
      else {
        uVar10 = br->val_;
      }
      uVar10 = uVar10 >> ((byte)uVar11 & 0x3f);
      pHVar12 = pHVar4 + 0x18c + (uVar10 & 0xff);
      uVar15 = (uint)pHVar12->bits;
      if (8 < uVar15) {
        uVar11 = uVar11 + 8;
        pHVar12 = pHVar12 + (ulong)pHVar12->value +
                            (ulong)((uint)(uVar10 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] &
                                   0x7f);
        uVar15 = (uint)pHVar12->bits;
      }
      (s->br).bit_pos_ = uVar15 + uVar11;
      local_34 = (uint)pHVar12->value;
    }
    else {
      local_34 = s->block_length_index;
    }
LAB_0010587b:
    bVar1 = kBlockLengthPrefixCode[local_34].nbits;
    uVar11 = (s->br).bit_pos_;
    uVar15 = 0x40 - uVar11;
    if (uVar15 < bVar1) {
      sVar14 = (s->br).avail_in;
      do {
        sVar14 = sVar14 - 1;
        if (sVar14 == 0xffffffffffffffff) {
          s->block_length_index = local_34;
LAB_00105941:
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar5;
          (s->br).bit_pos_ = uVar3;
          (s->br).next_in = (uint8_t *)local_40;
          (s->br).avail_in = sVar7;
          goto LAB_00105960;
        }
        uVar10 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        (s->br).val_ = uVar10 >> 8;
        uVar10 = (ulong)*pbVar6 << 0x38 | uVar10 >> 8;
        (s->br).val_ = uVar10;
        uVar11 = uVar11 - 8;
        (s->br).bit_pos_ = uVar11;
        (s->br).avail_in = sVar14;
        (s->br).next_in = pbVar6 + 1;
        uVar15 = uVar15 + 8;
      } while (uVar15 < bVar1);
    }
    else {
      uVar10 = br->val_;
    }
    uVar15 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = uVar11 + bVar1;
    s->block_length[1] =
         (uint)kBlockLengthPrefixCode[local_34].offset +
         ((uint)(uVar10 >> ((byte)uVar11 & 0x3f)) & uVar15);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_44 == 0) {
      local_44 = s->block_type_rb[2];
    }
    else if (local_44 == 1) {
      local_44 = s->block_type_rb[3] + 1;
    }
    else {
      local_44 = local_44 - 2;
    }
    uVar15 = 0;
    if (uVar2 <= local_44) {
      uVar15 = uVar2;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = local_44 - uVar15;
    s->htree_command = (s->insert_copy_hgroup).htrees[local_44 - uVar15];
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}